

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed)

{
  FieldType *pFVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  undefined1 local_d0 [8];
  ExtensionInfo info;
  Voidify local_89;
  FieldType local_88;
  uchar local_81;
  Nullable<const_char_*> local_80;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  Voidify local_61;
  FieldType local_60;
  uchar local_59;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_40;
  Voidify local_29;
  FieldType local_28;
  uchar local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *extendee_local;
  
  absl_log_internal_check_op_result._1_1_ = is_packed;
  absl_log_internal_check_op_result._2_1_ = is_repeated;
  absl_log_internal_check_op_result._3_1_ = type;
  absl_log_internal_check_op_result._4_4_ = number;
  pMStack_10 = extendee;
  local_21 = absl::lts_20250127::log_internal::GetReferenceableValue(type);
  local_28 = TYPE_ENUM;
  pFVar1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::WireFormatLite::FieldType>(&local_28);
  local_20 = absl::lts_20250127::log_internal::
             Check_NEImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                       (&local_21,pFVar1,"type != WireFormatLite::TYPE_ENUM");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x8a,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  local_59 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._3_1_);
  local_60 = TYPE_MESSAGE;
  pFVar1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::WireFormatLite::FieldType>(&local_60);
  local_58 = absl::lts_20250127::log_internal::
             Check_NEImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                       (&local_59,pFVar1,"type != WireFormatLite::TYPE_MESSAGE");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x8b,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&absl_log_internal_check_op_result_2);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&absl_log_internal_check_op_result_2);
  }
  local_81 = absl::lts_20250127::log_internal::GetReferenceableValue
                       (absl_log_internal_check_op_result._3_1_);
  local_88 = TYPE_GROUP;
  pFVar1 = absl::lts_20250127::log_internal::
           GetReferenceableValue<google::protobuf::internal::WireFormatLite::FieldType>(&local_88);
  local_80 = absl::lts_20250127::log_internal::
             Check_NEImpl<unsigned_char,google::protobuf::internal::WireFormatLite::FieldType>
                       (&local_81,pFVar1,"type != WireFormatLite::TYPE_GROUP");
  if (local_80 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_80);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&info.lazy_eager_verify_func,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x8c,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                       ((LogMessage *)&info.lazy_eager_verify_func);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&info.lazy_eager_verify_func);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_d0,pMStack_10,absl_log_internal_check_op_result._4_4_,
             absl_log_internal_check_op_result._3_1_,
             (bool)(absl_log_internal_check_op_result._2_1_ & 1),
             (bool)(absl_log_internal_check_op_result._1_1_ & 1));
  anon_unknown_59::Register((ExtensionInfo *)local_d0);
  return;
}

Assistant:

void ExtensionSet::RegisterExtension(const MessageLite* extendee, int number,
                                     FieldType type, bool is_repeated,
                                     bool is_packed) {
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_ENUM);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_MESSAGE);
  ABSL_CHECK_NE(type, WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  Register(info);
}